

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic.c
# Opt level: O0

int check_ans(N_Vector y,sunrealtype t,sunrealtype rtol,sunrealtype atol)

{
  double dVar1;
  uint uVar2;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  sunrealtype ewt;
  sunrealtype err;
  sunrealtype ans;
  int passfail;
  
  dVar1 = atan((double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
  dVar1 = (1.0 / (in_XMM1_Qa * ABS(dVar1) + in_XMM2_Qa)) *
          ABS(**(double **)(*in_RDI + 0x10) - dVar1);
  uVar2 = (uint)(1.0 <= dVar1);
  if (uVar2 != 0) {
    fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n",SUB84(dVar1,0));
  }
  return uVar2;
}

Assistant:

static int check_ans(N_Vector y, sunrealtype t, sunrealtype rtol, sunrealtype atol)
{
  int passfail = 0;          /* answer pass (0) or fail (1) flag     */
  sunrealtype ans, err, ewt; /* answer data, error, and error weight */

  /* compute solution error */
  ans = atan(t);
  ewt = SUN_RCONST(1.0) / (rtol * fabs(ans) + atol);
  err = ewt * fabs(NV_Ith_S(y, 0) - ans);

  /* is the solution within the tolerances? */
  passfail = (err < SUN_RCONST(1.0)) ? 0 : 1;

  if (passfail)
  {
    fprintf(stdout, "\nSUNDIALS_WARNING: check_ans error=%" GSYM "\n\n", err);
  }

  return (passfail);
}